

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O1

ImGuiTableSettings * __thiscall
ImChunkStream<ImGuiTableSettings>::next_chunk
          (ImChunkStream<ImGuiTableSettings> *this,ImGuiTableSettings *p)

{
  int iVar1;
  ImGuiTableSettings *pIVar2;
  ImGuiTableSettings *pIVar3;
  char *pcVar4;
  
  pcVar4 = (this->Buf).Data;
  if ((pcVar4 == (char *)0x0 || (ImGuiTableSettings *)(pcVar4 + 4) <= p) &&
     (pIVar3 = (ImGuiTableSettings *)(pcVar4 + (this->Buf).Size), p < pIVar3)) {
    iVar1._0_1_ = p[-1].ColumnsCount;
    iVar1._1_1_ = p[-1].ColumnsCountMax;
    iVar1._2_1_ = p[-1].WantApply;
    iVar1._3_1_ = p[-1].field_0xf;
    pIVar2 = (ImGuiTableSettings *)((long)&p->ID + (long)iVar1);
    if (pIVar2 == (ImGuiTableSettings *)&pIVar3->SaveFlags) {
      pIVar2 = (ImGuiTableSettings *)0x0;
    }
    else if (pIVar3 <= pIVar2) {
      pcVar4 = "p < end()";
      goto LAB_00167cef;
    }
    return pIVar2;
  }
  pcVar4 = "p >= begin() && p < end()";
LAB_00167cef:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_internal.h"
                ,0x25f,
                "T *ImChunkStream<ImGuiTableSettings>::next_chunk(T *) [T = ImGuiTableSettings]");
}

Assistant:

T*      next_chunk(T* p)            { size_t HDR_SZ = 4; IM_ASSERT(p >= begin() && p < end()); p = (T*)(void*)((char*)(void*)p + chunk_size(p)); if (p == (T*)(void*)((char*)end() + HDR_SZ)) return (T*)0; IM_ASSERT(p < end()); return p; }